

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtObj.c
# Opt level: O1

int NewtRefFunctionType(newtRefArg r)

{
  _Bool _Var1;
  bool bVar2;
  uint16_t uVar3;
  newtRef r1;
  int iVar4;
  
  iVar4 = 1;
  uVar3 = NewtGetRefType(r,true);
  if (uVar3 != 0xb) {
    return 0;
  }
  r1 = NcClassOf(r);
  _Var1 = NewtRefEqual(r1,newt_sym.CodeBlock);
  if (!_Var1) {
    if (r1 == 0x32) {
      iVar4 = 2;
    }
    else {
      _Var1 = NewtRefEqual(r1,newt_sym._function.native0);
      if (!_Var1) {
        _Var1 = NewtRefEqual(r1,newt_sym._function.native);
        bVar2 = !_Var1;
        iVar4 = 4;
        goto LAB_00107eb4;
      }
      iVar4 = 3;
    }
  }
  bVar2 = false;
LAB_00107eb4:
  if (bVar2) {
    return 0;
  }
  return iVar4;
}

Assistant:

int NewtRefFunctionType(newtRefArg r)
{
    if (NewtRefIsFrame(r))
    {
        newtRefVar	klass;
        
        klass = NcClassOf(r);
        
        if (NewtRefEqual(klass, NSSYM0(CodeBlock)))
            return kNewtCodeBlock;
        
        if (klass==50) // special code
            return kNewtCodeBlock21;

        if (NewtRefEqual(klass, NSSYM0(_function.native0)))
            return kNewtNativeFn;
        
        if (NewtRefEqual(klass, NSSYM0(_function.native)))
            return kNewtNativeFunc;
    }
    
    return kNewtNotFunction;
}